

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

bool __thiscall Json::StyledStreamWriter::hasCommentForValue(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  
  bVar1 = Value::hasComment(value,commentBefore);
  if (!bVar1) {
    bVar1 = Value::hasComment(value,commentAfterOnSameLine);
    if (!bVar1) {
      bVar1 = Value::hasComment(value,commentAfter);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool 
StyledStreamWriter::hasCommentForValue( const Value &value )
{
   return value.hasComment( commentBefore )
          ||  value.hasComment( commentAfterOnSameLine )
          ||  value.hasComment( commentAfter );
}